

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaCheckAttrUsePropsCorrect
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaAttributeUsePtr_conflict use)

{
  xmlSchemaValPtr *retVal;
  xmlSchemaTypePtr *ppxVar1;
  xmlSchemaTypePtr type;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  xmlSchemaAttributePtr in_RAX;
  xmlSchemaTypePtr pxVar4;
  xmlSchemaAttributePtr extraout_RAX;
  xmlSchemaAttributePtr extraout_RAX_00;
  char *pcVar5;
  xmlSchemaValPtr *str2;
  xmlChar *str1;
  
  if ((((use == (xmlSchemaAttributeUsePtr_conflict)0x0) || (use->defValue == (xmlChar *)0x0)) ||
      (in_RAX = use->attrDecl, in_RAX == (xmlSchemaAttributePtr)0x0)) ||
     (in_RAX->type != XML_SCHEMA_TYPE_ATTRIBUTE)) goto LAB_0019cf95;
  if (((in_RAX->defValue == (xmlChar *)0x0) || ((in_RAX->flags & 0x200) == 0)) ||
     ((use->flags & 1) != 0)) {
    retVal = &use->defVal;
    if ((use->defVal != (xmlSchemaValPtr)0x0) &&
       (type = in_RAX->subtypes, pxVar4 = type, type != (xmlSchemaTypePtr)0x0)) {
      do {
        if ((pxVar4->type == XML_SCHEMA_TYPE_COMPLEX) ||
           (iVar2 = pxVar4->builtInType, iVar2 == 0x2d)) break;
        if (pxVar4->type == XML_SCHEMA_TYPE_BASIC) {
          if (iVar2 == 0x17) {
            pcVar5 = 
            "Value constraints are not allowed if the type definition is or is derived from xs:ID";
            goto LAB_0019cf80;
          }
          if (iVar2 == 0x2e) break;
        }
        ppxVar1 = &pxVar4->subtypes;
        pxVar4 = *ppxVar1;
      } while (*ppxVar1 != (xmlSchemaTypePtr)0x0);
      str2 = retVal;
      iVar2 = xmlSchemaVCheckCVCSimpleType
                        ((xmlSchemaAbstractCtxtPtr)ctxt,use->node,type,use->defValue,retVal,1,1,0);
      if (iVar2 != 0) {
        if (iVar2 < 0) {
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)ctxt,"xmlSchemaCheckAttrUsePropsCorrect",
                     "calling xmlSchemaVCheckCVCSimpleType()",(xmlChar *)0x0,(xmlChar *)str2);
          return extraout_EAX;
        }
        pcVar5 = "The value of the value constraint is not valid";
LAB_0019cf80:
        xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_AU_PROPS_CORRECT,
                            (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)use,pcVar5,(xmlChar *)0x0,
                            (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        in_RAX = extraout_RAX_00;
        goto LAB_0019cf95;
      }
      in_RAX = use->attrDecl;
    }
    if ((in_RAX->defVal == (xmlSchemaValPtr)0x0) || ((in_RAX->flags & 1) != 0)) goto LAB_0019cf95;
    uVar3 = xmlSchemaAreValuesEqual(*retVal,in_RAX->defVal);
    in_RAX = (xmlSchemaAttributePtr)(ulong)uVar3;
    if (uVar3 != 0) goto LAB_0019cf95;
    str1 = use->attrDecl->defValue;
    pcVar5 = 
    "The \'fixed\' value constraint of the attribute use must match the attribute declaration\'s value constraint \'%s\'"
    ;
  }
  else {
    pcVar5 = 
    "The attribute declaration has a \'fixed\' value constraint , thus the attribute use must also have a \'fixed\' value constraint"
    ;
    str1 = (xmlChar *)0x0;
  }
  xmlSchemaPCustomErrExt
            (ctxt,XML_SCHEMAP_AU_PROPS_CORRECT_2,(xmlSchemaBasicItemPtr)use,(xmlNodePtr)0x0,pcVar5,
             str1,(xmlChar *)0x0,(xmlChar *)0x0);
  in_RAX = extraout_RAX;
LAB_0019cf95:
  return (int)in_RAX;
}

Assistant:

static int
xmlSchemaCheckAttrUsePropsCorrect(xmlSchemaParserCtxtPtr ctxt,
			     xmlSchemaAttributeUsePtr use)
{
    if ((ctxt == NULL) || (use == NULL))
	return(-1);
    if ((use->defValue == NULL) || (WXS_ATTRUSE_DECL(use) == NULL) ||
	((WXS_ATTRUSE_DECL(use))->type != XML_SCHEMA_TYPE_ATTRIBUTE))
	return(0);

    /*
    * SPEC au-props-correct (1)
    * "The values of the properties of an attribute use must be as
    * described in the property tableau in The Attribute Use Schema
    * Component ($3.5.1), modulo the impact of Missing
    * Sub-components ($5.3)."
    */

    if (((WXS_ATTRUSE_DECL(use))->defValue != NULL) &&
	((WXS_ATTRUSE_DECL(use))->flags & XML_SCHEMAS_ATTR_FIXED) &&
        ((use->flags & XML_SCHEMA_ATTR_USE_FIXED) == 0))
    {
	xmlSchemaPCustomErr(ctxt,
	    XML_SCHEMAP_AU_PROPS_CORRECT_2,
	    WXS_BASIC_CAST use, NULL,
	    "The attribute declaration has a 'fixed' value constraint "
	    ", thus the attribute use must also have a 'fixed' value "
	    "constraint",
	    NULL);
	return(ctxt->err);
    }
    /*
    * Compute and check the value constraint's value.
    */
    if ((use->defVal != NULL) && (WXS_ATTRUSE_TYPEDEF(use) != NULL)) {
	int ret;
	/*
	* TODO: The spec seems to be missing a check of the
	* value constraint of the attribute use. We will do it here.
	*/
	/*
	* SPEC a-props-correct (3)
	*/
	if (xmlSchemaIsDerivedFromBuiltInType(
	    WXS_ATTRUSE_TYPEDEF(use), XML_SCHEMAS_ID))
	{
	    xmlSchemaCustomErr(ACTXT_CAST ctxt,
		XML_SCHEMAP_AU_PROPS_CORRECT,
		NULL, WXS_BASIC_CAST use,
		"Value constraints are not allowed if the type definition "
		"is or is derived from xs:ID",
		NULL, NULL);
	    return(ctxt->err);
	}

	ret = xmlSchemaVCheckCVCSimpleType(ACTXT_CAST ctxt,
	    use->node, WXS_ATTRUSE_TYPEDEF(use),
	    use->defValue, &(use->defVal),
	    1, 1, 0);
	if (ret != 0) {
	    if (ret < 0) {
		PERROR_INT2("xmlSchemaCheckAttrUsePropsCorrect",
		    "calling xmlSchemaVCheckCVCSimpleType()");
		return(-1);
	    }
	    xmlSchemaCustomErr(ACTXT_CAST ctxt,
		XML_SCHEMAP_AU_PROPS_CORRECT,
		NULL, WXS_BASIC_CAST use,
		"The value of the value constraint is not valid",
		NULL, NULL);
	    return(ctxt->err);
	}
    }
    /*
    * SPEC au-props-correct (2)
    * "If the {attribute declaration} has a fixed
    * {value constraint}, then if the attribute use itself has a
    * {value constraint}, it must also be fixed and its value must match
    * that of the {attribute declaration}'s {value constraint}."
    */
    if (((WXS_ATTRUSE_DECL(use))->defVal != NULL) &&
	(((WXS_ATTRUSE_DECL(use))->flags & XML_SCHEMA_ATTR_USE_FIXED) == 0))
    {
	if (! xmlSchemaAreValuesEqual(use->defVal,
		(WXS_ATTRUSE_DECL(use))->defVal))
	{
	    xmlSchemaPCustomErr(ctxt,
		XML_SCHEMAP_AU_PROPS_CORRECT_2,
		WXS_BASIC_CAST use, NULL,
		"The 'fixed' value constraint of the attribute use "
		"must match the attribute declaration's value "
		"constraint '%s'",
		(WXS_ATTRUSE_DECL(use))->defValue);
	}
	return(ctxt->err);
    }
    return(0);
}